

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  ushort uVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_io_methods *psVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  sqlite3_io_methods *psVar8;
  char **ppcVar9;
  size_t sVar10;
  unixShmNode *puVar11;
  sqlite3_mutex *psVar12;
  u64 n;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  unixShmNode *zBuf;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  stat sStat;
  int local_100;
  int local_e4;
  undefined1 local_c0 [24];
  uint local_a8;
  uint local_a4;
  undefined4 local_a0;
  long local_90;
  
  uVar4 = (*aSyscall[0x19].pCurrent)();
  uVar20 = 1;
  if (0x7fff < (int)uVar4) {
    uVar20 = uVar4 >> 0xf;
  }
  psVar8 = fd[8].pMethods;
  if (psVar8 == (sqlite3_io_methods *)0x0) {
    iVar19 = sqlite3_initialize();
    if (iVar19 != 0) {
      return 7;
    }
    psVar8 = (sqlite3_io_methods *)sqlite3Malloc(0x18);
    if (psVar8 == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    *(undefined8 *)psVar8 = 0;
    psVar8->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    psVar8->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
    }
    psVar2 = fd[2].pMethods;
    puVar11 = (unixShmNode *)psVar2->xLock;
    local_e4 = 0;
    if (puVar11 == (unixShmNode *)0x0) {
      psVar3 = fd[7].pMethods;
      iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
      iVar19 = 0x70a;
      if (iVar5 == 0) {
        sVar10 = strlen((char *)psVar3);
        iVar5 = sqlite3_initialize();
        iVar19 = 7;
        if (iVar5 == 0) {
          local_100 = (int)sVar10;
          puVar11 = (unixShmNode *)sqlite3Malloc((long)local_100 + 0x66U);
          if (puVar11 != (unixShmNode *)0x0) {
            local_e4 = 0;
            memset(puVar11,0,(long)local_100 + 0x66U);
            zBuf = puVar11 + 1;
            puVar11->zFilename = (char *)zBuf;
            sqlite3_snprintf(local_100 + 6,(char *)zBuf,"%s-shm",psVar3);
            puVar11->hShm = -1;
            psVar3 = fd[2].pMethods;
            psVar3->xLock = (_func_int_sqlite3_file_ptr_int *)puVar11;
            puVar11->pInode = (unixInodeInfo *)psVar3;
            if (sqlite3Config.bCoreMutex == '\0') {
LAB_0012fce7:
              if (*(char *)((long)&psVar2->xTruncate + 1) != '\0') goto LAB_0012f9d6;
              iVar19 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
              if (iVar19 == 0) {
                uVar4 = robust_open((char *)zBuf,0x20042,local_a8 & 0x1ff);
                puVar11->hShm = uVar4;
              }
              else {
                uVar4 = puVar11->hShm;
              }
              if ((int)uVar4 < 0) {
                uVar4 = robust_open((char *)zBuf,0x20000,local_a8 & 0x1ff);
                puVar11->hShm = uVar4;
                if ((int)uVar4 < 0) {
                  sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xa567,
                              "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
                  unixLogErrorAtLine(0xe,"open",(char *)zBuf,0xa567);
                  iVar19 = 0xe;
                  goto LAB_0012fbae;
                }
                puVar11->isReadonly = '\x01';
              }
              iVar19 = (*aSyscall[0x15].pCurrent)();
              if (iVar19 == 0) {
                (*aSyscall[0x14].pCurrent)((ulong)uVar4,(ulong)local_a4,local_a0);
              }
              local_e4 = unixLockSharedMemory((unixFile *)fd,puVar11);
              if ((local_e4 == 0x508) || (iVar19 = local_e4, local_e4 == 0)) goto LAB_0012f9d6;
            }
            else {
              iVar5 = sqlite3_initialize();
              if (iVar5 == 0) {
                psVar12 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                puVar11->pShmMutex = psVar12;
                if (psVar12 != (sqlite3_mutex *)0x0) goto LAB_0012fce7;
              }
              else {
                puVar11->pShmMutex = (sqlite3_mutex *)0x0;
              }
            }
          }
        }
      }
LAB_0012fbae:
      unixShmPurge((unixFile *)fd);
      sqlite3_free(psVar8);
      psVar12 = unixBigLock;
      goto LAB_0012fa4b;
    }
LAB_0012f9d6:
    *(unixShmNode **)psVar8 = puVar11;
    puVar11->nRef = puVar11->nRef + 1;
    fd[8].pMethods = psVar8;
    if (unixBigLock != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
    }
    if (puVar11->pShmMutex == (sqlite3_mutex *)0x0) {
      psVar8->xClose = (_func_int_sqlite3_file_ptr *)puVar11->pFirst;
      puVar11->pFirst = (unixShm *)psVar8;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(puVar11->pShmMutex);
      psVar12 = puVar11->pShmMutex;
      psVar8->xClose = (_func_int_sqlite3_file_ptr *)puVar11->pFirst;
      puVar11->pFirst = (unixShm *)psVar8;
      if (psVar12 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar12);
      }
    }
    if (local_e4 != 0) {
      return local_e4;
    }
    psVar8 = fd[8].pMethods;
  }
  puVar11 = *(unixShmNode **)psVar8;
  if (puVar11->pShmMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(puVar11->pShmMutex);
  }
  if (puVar11->isUnlocked == '\0') {
LAB_0012f839:
    iVar19 = (uVar20 + iRegion) - (int)(uVar20 + iRegion) % (int)uVar20;
    iVar5 = 0;
    if ((int)(uint)puVar11->nRegion < iVar19) {
      puVar11->szRegion = szRegion;
      if (-1 < puVar11->hShm) {
        iVar6 = (*aSyscall[5].pCurrent)((ulong)(uint)puVar11->hShm,local_c0);
        iVar5 = 0x130a;
        if (iVar6 != 0) goto LAB_0012f957;
        iVar5 = iVar19 * szRegion;
        if (local_90 < iVar5) {
          if (bExtend == 0) {
            iVar5 = 0;
            goto LAB_0012f957;
          }
          lVar18 = local_90 + 0xfff;
          if (-1 < local_90) {
            lVar18 = local_90;
          }
          iVar6 = iVar5 + 0xfff;
          if (-1 < iVar5) {
            iVar6 = iVar5;
          }
          iVar5 = (int)(lVar18 >> 0xc);
          if (iVar5 < iVar6 >> 0xc) {
            lVar18 = (long)iVar5;
            do {
              uVar4 = puVar11->hShm;
              while (iVar5 = (*aSyscall[0xc].pCurrent)((ulong)uVar4,"",1,lVar18 << 0xc | 0xfff),
                    iVar5 < 0) {
                puVar7 = (uint *)__errno_location();
                if (*puVar7 != 4) goto LAB_0012fd1c;
              }
              if (iVar5 != 1) {
                puVar7 = (uint *)__errno_location();
LAB_0012fd1c:
                pcVar17 = puVar11->zFilename;
                uVar20 = *puVar7;
                if (pcVar17 == (char *)0x0) {
                  pcVar17 = "";
                }
                pcVar16 = "write";
                iVar5 = 0x130a;
                iVar19 = 0x130a;
                uVar15 = 0xa5f7;
                goto LAB_0012fd4a;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != iVar6 >> 0xc);
          }
        }
      }
      ppcVar9 = puVar11->apRegion;
      iVar6 = sqlite3_initialize();
      iVar5 = 0xc0a;
      if (iVar6 == 0) {
        uVar4 = iVar19 * 8;
        if (iVar19 * 8 < 1) {
          uVar4 = 0;
        }
        ppcVar9 = (char **)sqlite3Realloc(ppcVar9,(ulong)uVar4);
        if (ppcVar9 != (char **)0x0) {
          puVar11->apRegion = ppcVar9;
          uVar13 = (ulong)puVar11->nRegion;
          iVar5 = 0;
          if ((int)(uint)puVar11->nRegion < iVar19) {
            n = (u64)(int)(uVar20 * szRegion);
            do {
              if (-1 < puVar11->hShm) {
                pcVar17 = (char *)(*aSyscall[0x16].pCurrent)
                                            (0,n,(ulong)((uint)(puVar11->isReadonly == '\0') * 2 + 1
                                                        ),1,(ulong)(uint)puVar11->hShm,
                                             (uVar13 & 0xffff) * (long)szRegion);
                if (pcVar17 != (char *)0xffffffffffffffff) goto LAB_0012fb37;
                pcVar17 = puVar11->zFilename;
                puVar7 = (uint *)__errno_location();
                uVar20 = *puVar7;
                if (pcVar17 == (char *)0x0) {
                  pcVar17 = "";
                }
                pcVar16 = "mmap";
                iVar5 = 0x150a;
                iVar19 = 0x150a;
                uVar15 = 0xa612;
LAB_0012fd4a:
                sqlite3_log(iVar19,"os_unix.c:%d: (%d) %s(%s) - %s",uVar15,(ulong)uVar20,pcVar16,
                            pcVar17,"");
                break;
              }
              iVar6 = sqlite3_initialize();
              iVar5 = 7;
              if ((iVar6 != 0) || (pcVar17 = (char *)sqlite3Malloc(n), pcVar17 == (char *)0x0))
              break;
              memset(pcVar17,0,n);
LAB_0012fb37:
              uVar1 = puVar11->nRegion;
              uVar14 = (ulong)uVar1;
              uVar13 = (ulong)uVar20;
              if (uVar20 != 0) {
                do {
                  puVar11->apRegion[uVar14] = pcVar17;
                  uVar14 = uVar14 + 1;
                  pcVar17 = pcVar17 + szRegion;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              uVar4 = uVar1 + uVar20;
              uVar13 = (ulong)uVar4;
              puVar11->nRegion = (u16)uVar4;
              iVar5 = 0;
            } while ((int)(uVar4 & 0xffff) < iVar19);
          }
        }
      }
    }
  }
  else {
    iVar5 = unixLockSharedMemory((unixFile *)fd,puVar11);
    if (iVar5 == 0) {
      puVar11->isUnlocked = '\0';
      goto LAB_0012f839;
    }
  }
LAB_0012f957:
  if (iRegion < (int)(uint)puVar11->nRegion) {
    pcVar17 = puVar11->apRegion[iRegion];
  }
  else {
    pcVar17 = (char *)0x0;
  }
  *pp = pcVar17;
  iVar19 = 8;
  if (puVar11->isReadonly == '\0') {
    iVar19 = iVar5;
  }
  if (iVar5 != 0) {
    iVar19 = iVar5;
  }
  psVar12 = puVar11->pShmMutex;
LAB_0012fa4b:
  if (psVar12 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar12);
  }
  return iVar19;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  if( pShmNode->isUnlocked ){
    rc = unixLockSharedMemory(pDbFd, pShmNode);
    if( rc!=SQLITE_OK ) goto shmpage_out;
    pShmNode->isUnlocked = 0;
  }
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->hShm>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->hShm, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }

      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->hShm, iPg*pgsz + pgsz-1,"",1,&x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->hShm>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE,
            MAP_SHARED, pShmNode->hShm, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(nMap);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, nMap);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  return rc;
}